

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dblp.cpp
# Opt level: O2

void * parseArticle(SymbolContext<char> *ctx)

{
  long lVar1;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this;
  const_iterator this_00;
  const_iterator pxVar2;
  xpath_node *node;
  xml_node local_130;
  char_t *local_128;
  xpath_node_set authors;
  xml_document doc;
  
  if (ctx->num_values < 1) {
    this = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)0x0;
  }
  else {
    this = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)operator_new(0x18);
    *(undefined8 *)(this + 0x10) = 0;
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
    pugi::xml_document::xml_document(&doc);
    lVar1 = ctx->symbol->start;
    pugi::xml_document::load_buffer
              ((xml_parse_result *)&authors,&doc,(void *)((long)ctx->context->m_window + lVar1),
               ctx->symbol->end - lVar1,0x74,encoding_auto);
    pugi::xml_node::select_nodes
              (&authors,&doc.super_xml_node,(char_t *)"/article/author/text()",
               (xpath_variable_set *)0x0);
    this_00 = pugi::xpath_node_set::begin(&authors);
    pxVar2 = pugi::xpath_node_set::end(&authors);
    for (; this_00 != pxVar2; this_00 = this_00 + 1) {
      local_130 = pugi::xpath_node::node(this_00);
      local_128 = pugi::xml_node::value(&local_130);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const*>(this,(char **)&local_128);
    }
    pugi::xpath_node_set::~xpath_node_set(&authors);
    pugi::xml_document::~xml_document(&doc);
  }
  return this;
}

Assistant:

void *parseArticle(const SymbolContext<char>& ctx)
{
  if (ctx.count() > 0) {
    auto ret = new std::vector<std::string>;
    pugi::xml_document doc;
    doc.load_buffer(ctx.start(), ctx.end() -  ctx.start());
    pugi::xpath_node_set authors = doc.select_nodes("/article/author/text()");
    for (auto& node : authors) {
      ret->emplace_back(node.node().value());
    }
    return ret;
  } else {
    return nullptr;
  }
}